

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall main::anon_class_8_1_89897dde::operator()(anon_class_8_1_89897dde *this)

{
  printf("Usage: %s -S [-e/-t] <source.sy> -o <output.eeyore>\n",**this->argv);
  exit(0xff);
}

Assistant:

int main(int argc, char **argv) {
  const auto die_args_invalid = [&] () {
    printf("Usage: %s -S [-e/-t] <source.sy> -o <output.eeyore>\n", argv[0]);
    exit(255);
  };
  
  int mode = 2;   // 0: eeyore; 1: tigger; 2: riscv.
  const char *input = NULL, *output = NULL;
  if(argc < 5) die_args_invalid();
  for(int i = 1, nxtoutput = 0; i < argc; ++i) {
    if(argv[i][0] == '-') {
      if(argv[i][2]) die_args_invalid();
      switch(argv[i][1]) {
      case 'S':
        break;
      case 'e':
        mode = 0;
        break;
      case 't':
        mode = 1;
        break;
      case 'o':
        nxtoutput = 1;
        break;
      default:
        die_args_invalid();
      }
    }
    else {
      if(nxtoutput) {
        nxtoutput = 0;
        output = argv[i];
      }
      else {
        input = argv[i];
      }
    }
  }
  if(!output || !input) die_args_invalid();
  // printf("output = %s, input = %s, mode = %d\n", output, input, mode);
  
  std::ofstream fout(output);
  std::shared_ptr<ast_compunit> sysy = read_source_ast(input);
  std::shared_ptr<ee_program> eeyore = eeyore_gen(sysy);
  
  // optimization
  eeyore = eeyore_optim_commonexp(eeyore);
  
  if(mode == 0) { // eeyore
    dump_eeyore(eeyore, fout);
    return 0;
  }
  std::shared_ptr<tg_program> tigger = tigger_gen(eeyore);
  if(mode == 1) {
    dump_tigger(tigger, fout);
  }
  else {
    dump_riscv(tigger, fout);
  }
  return 0;
}